

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_check_id(lys_node *node,lys_node *parent,lys_module *module)

{
  LYS_NODE LVar1;
  lys_module *plVar2;
  lys_node_grp *plVar3;
  lys_node **pplVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  int up;
  int down;
  lys_node_grp *grp;
  lys_node *iter;
  lys_node *stop;
  lys_node *start;
  lys_module *module_local;
  lys_node *parent_local;
  lys_node *node_local;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x211,
                  "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
  }
  if (parent == (lys_node *)0x0) {
    start = (lys_node *)module;
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x214,
                    "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
    }
  }
  else {
    start = (lys_node *)parent->module;
  }
  plVar2 = lys_main_module((lys_module *)start);
  LVar1 = node->nodetype;
  if ((((1 < LVar1 - LYS_CONTAINER) && (LVar1 != LYS_LEAF)) && (LVar1 != LYS_LEAFLIST)) &&
     (LVar1 != LYS_LIST)) {
    if (LVar1 == LYS_CASE) {
      if (parent == (lys_node *)0x0) {
        stop = plVar2->data;
      }
      else {
        pplVar4 = lys_child(parent,LYS_CASE);
        stop = *pplVar4;
      }
      grp = (lys_node_grp *)stop;
      while( true ) {
        if (grp == (lys_node_grp *)0x0) {
          return 0;
        }
        if ((((grp->nodetype & 0x807d) != LYS_UNKNOWN) && (grp->module == node->module)) &&
           (grp->name == node->name)) break;
        grp = (lys_node_grp *)grp->next;
      }
      ly_vlog(LYE_DUPID,LY_VLOG_LYS,node,"case",node->name);
      return 1;
    }
    if (LVar1 == LYS_GROUPING) {
      if (parent == (lys_node *)0x0) {
        bVar7 = true;
        bVar6 = true;
        stop = plVar2->data;
      }
      else {
        pplVar4 = lys_child(parent,LYS_GROUPING);
        stop = *pplVar4;
        bVar6 = stop != (lys_node *)0x0;
        if (!bVar6) {
          stop = parent;
        }
        bVar7 = parent->nodetype != LYS_EXT;
      }
      if ((bVar7) && (plVar3 = lys_find_grouping_up(node->name,stop), plVar3 != (lys_node_grp *)0x0)
         ) {
        ly_vlog(LYE_DUPID,LY_VLOG_LYS,node,"grouping",node->name);
        return 1;
      }
      if (!bVar6) {
        return 0;
      }
      grp = (lys_node_grp *)stop;
      iter = (lys_node *)0x0;
      do {
        if (grp == (lys_node_grp *)0x0) {
          return 0;
        }
        if (iter == (lys_node *)0x0) {
          iter = stop;
        }
        else if (grp == (lys_node_grp *)iter) {
          return 0;
        }
        if ((grp->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER))
            != LYS_UNKNOWN) {
          _up = (lys_node_grp *)0x0;
          while (_up = lys_get_next_grouping(_up,(lys_node *)grp), _up != (lys_node_grp *)0x0) {
            if (node->name == _up->name) {
              ly_vlog(LYE_DUPID,LY_VLOG_LYS,node,"grouping",node->name);
              return 1;
            }
          }
        }
        grp = (lys_node_grp *)grp->prev;
      } while( true );
    }
    if (LVar1 != LYS_ANYDATA) {
      return 0;
    }
  }
  grp = (lys_node_grp *)parent;
  if (parent == (lys_node *)0x0) {
    iter = (lys_node *)0x0;
    grp = (lys_node_grp *)plVar2->data;
  }
  else {
    while( true ) {
      iter = (lys_node *)grp;
      bVar7 = false;
      if (grp != (lys_node_grp *)0x0) {
        bVar7 = (grp->nodetype & (LYS_AUGMENT|LYS_USES|LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN;
      }
      if (!bVar7) break;
      if (grp->nodetype == LYS_AUGMENT) {
        if (grp->prev == (lys_node *)0x0) break;
        grp = (lys_node_grp *)grp->prev;
      }
      else {
        grp = (lys_node_grp *)grp->parent;
      }
    }
    if (grp == (lys_node_grp *)0x0) {
      iter = (lys_node *)0x0;
      grp = (lys_node_grp *)plVar2->data;
    }
    else {
      if (grp->nodetype == LYS_EXT) {
        pplVar4 = lys_child((lys_node *)grp,node->nodetype);
        grp = (lys_node_grp *)*pplVar4;
      }
      else {
        grp = (lys_node_grp *)grp->child;
      }
    }
  }
  do {
    while( true ) {
      while( true ) {
        if (grp == (lys_node_grp *)0x0) {
          return 0;
        }
        if ((grp->nodetype & (LYS_USES|LYS_CASE)) == LYS_UNKNOWN) break;
        grp = (lys_node_grp *)grp->child;
      }
      if ((((grp->nodetype & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER))
            != LYS_UNKNOWN) && (grp->module == node->module)) && (grp->name == node->name)) {
        pcVar5 = strnodetype(node->nodetype);
        ly_vlog(LYE_DUPID,LY_VLOG_LYS,node,pcVar5,node->name);
        return 1;
      }
      if (grp->nodetype != LYS_CHOICE) break;
      grp = (lys_node_grp *)grp->child;
    }
    if (grp->next == (lys_node *)0x0) {
      while (grp->parent != iter) {
        grp = (lys_node_grp *)lys_parent((lys_node *)grp);
        if (((grp != (lys_node_grp *)0x0) && (grp->next != (lys_node *)0x0)) ||
           (grp == (lys_node_grp *)iter)) goto LAB_00179847;
      }
      grp = (lys_node_grp *)iter;
LAB_00179847:
      if (grp == (lys_node_grp *)iter) {
        return 0;
      }
    }
    grp = (lys_node_grp *)grp->next;
  } while( true );
}

Assistant:

int
lys_check_id(struct lys_node *node, struct lys_node *parent, struct lys_module *module)
{
    struct lys_node *start, *stop, *iter;
    struct lys_node_grp *grp;
    int down, up;

    assert(node);

    if (!parent) {
        assert(module);
    } else {
        module = parent->module;
    }
    module = lys_main_module(module);

    switch (node->nodetype) {
    case LYS_GROUPING:
        /* 6.2.1, rule 6 */
        if (parent) {
            start = *lys_child(parent, LYS_GROUPING);
            if (!start) {
                down = 0;
                start = parent;
            } else {
                down = 1;
            }
            if (parent->nodetype == LYS_EXT) {
                up = 0;
            } else {
                up = 1;
            }
        } else {
            down = up = 1;
            start = module->data;
        }
        /* go up */
        if (up && lys_find_grouping_up(node->name, start)) {
            LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, "grouping", node->name);
            return EXIT_FAILURE;
        }
        /* go down, because grouping can be defined after e.g. container in which is collision */
        if (down) {
            for (iter = start, stop = NULL; iter; iter = iter->prev) {
                if (!stop) {
                    stop = start;
                } else if (iter == stop) {
                    break;
                }
                if (!(iter->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LIST | LYS_GROUPING | LYS_INPUT | LYS_OUTPUT))) {
                    continue;
                }

                grp = NULL;
                while ((grp = lys_get_next_grouping(grp, iter))) {
                    if (ly_strequal(node->name, grp->name, 1)) {
                        LOGVAL(LYE_DUPID,LY_VLOG_LYS, node, "grouping", node->name);
                        return EXIT_FAILURE;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_LIST:
    case LYS_CONTAINER:
    case LYS_CHOICE:
    case LYS_ANYDATA:
        /* 6.2.1, rule 7 */
        if (parent) {
            iter = parent;
            while (iter && (iter->nodetype & (LYS_USES | LYS_CASE | LYS_CHOICE | LYS_AUGMENT))) {
                if (iter->nodetype == LYS_AUGMENT) {
                    if (((struct lys_node_augment *)iter)->target) {
                        /* augment is resolved, go up */
                        iter = ((struct lys_node_augment *)iter)->target;
                        continue;
                    }
                    /* augment is not resolved, this is the final parent */
                    break;
                }
                iter = iter->parent;
            }

            if (!iter) {
                stop = NULL;
                iter = module->data;
            } else if (iter->nodetype == LYS_EXT) {
                stop = iter;
                iter = *lys_child(iter, node->nodetype);
            } else {
                stop = iter;
                iter = iter->child;
            }
        } else {
            stop = NULL;
            iter = module->data;
        }
        while (iter) {
            if (iter->nodetype & (LYS_USES | LYS_CASE)) {
                iter = iter->child;
                continue;
            }

            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CONTAINER | LYS_CHOICE | LYS_ANYDATA)) {
                if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                    LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, strnodetype(node->nodetype), node->name);
                    return EXIT_FAILURE;
                }
            }

            /* special case for choice - we must check the choice's name as
             * well as the names of nodes under the choice
             */
            if (iter->nodetype == LYS_CHOICE) {
                iter = iter->child;
                continue;
            }

            /* go to siblings */
            if (!iter->next) {
                /* no sibling, go to parent's sibling */
                do {
                    /* for parent LYS_AUGMENT */
                    if (iter->parent == stop) {
                        iter = stop;
                        break;
                    }
                    iter = lys_parent(iter);
                    if (iter && iter->next) {
                        break;
                    }
                } while (iter != stop);

                if (iter == stop) {
                    break;
                }
            }
            iter = iter->next;
        }
        break;
    case LYS_CASE:
        /* 6.2.1, rule 8 */
        if (parent) {
            start = *lys_child(parent, LYS_CASE);
        } else {
            start = module->data;
        }

        LY_TREE_FOR(start, iter) {
            if (!(iter->nodetype & (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST))) {
                continue;
            }

            if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, "case", node->name);
                return EXIT_FAILURE;
            }
        }
        break;
    default:
        /* no check needed */
        break;
    }

    return EXIT_SUCCESS;
}